

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::TestVectorTypesBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  _Hash_node_base *p_Var1;
  char cVar2;
  bool bVar3;
  int iVar4;
  reference __x;
  pointer pTVar5;
  InternalException *this_00;
  unsigned_long uVar6;
  pointer *__ptr;
  char cVar7;
  ulong __n;
  templated_unique_single_t result;
  string __str;
  string name;
  _Head_base<0UL,_duckdb::TestVectorBindData_*,_false> local_88;
  char *local_80;
  uint local_78;
  char local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_40;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  local_40._M_head_impl = (FunctionData *)this;
  local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names;
  local_88._M_head_impl = (TestVectorBindData *)operator_new(0x40);
  ((local_88._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)0x0;
  ((local_88._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_88._M_head_impl)->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(local_88._M_head_impl)->all_flat = 0;
  ((local_88._M_head_impl)->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_88._M_head_impl)->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   ((long)&((local_88._M_head_impl)->super_TableFunctionData).column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((local_88._M_head_impl)->super_TableFunctionData).column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  ((local_88._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__TestVectorBindData_019b3300;
  *(undefined8 *)
   ((long)&((local_88._M_head_impl)->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&((local_88._M_head_impl)->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  if ((input->inputs->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (input->inputs->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"test_vector","");
      if (__n != 0) {
        cVar7 = '\x01';
        if (8 < __n) {
          uVar6 = __n + 1;
          cVar2 = '\x04';
          do {
            cVar7 = cVar2;
            if (uVar6 < 100) {
              cVar7 = cVar7 + -2;
              goto LAB_00a4a853;
            }
            if (uVar6 < 1000) {
              cVar7 = cVar7 + -1;
              goto LAB_00a4a853;
            }
            if (uVar6 < 10000) goto LAB_00a4a853;
            bVar3 = 99999 < uVar6;
            uVar6 = uVar6 / 10000;
            cVar2 = cVar7 + '\x04';
          } while (bVar3);
          cVar7 = cVar7 + '\x01';
        }
LAB_00a4a853:
        local_80 = local_70;
        ::std::__cxx11::string::_M_construct((ulong)&local_80,cVar7);
        ::std::__detail::__to_chars_10_impl<unsigned_long>(local_80,local_78,__n + 1);
        ::std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80);
        if (local_80 != local_70) {
          operator_delete(local_80);
        }
      }
      __x = vector<duckdb::Value,_true>::operator[](input->inputs,__n);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>(local_38,&local_60);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&return_types->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &__x->type_);
      pTVar5 = unique_ptr<duckdb::TestVectorBindData,_std::default_delete<duckdb::TestVectorBindData>,_true>
               ::operator->((unique_ptr<duckdb::TestVectorBindData,_std::default_delete<duckdb::TestVectorBindData>,_true>
                             *)&local_88);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&(pTVar5->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &__x->type_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(input->inputs->
                                 super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(input->inputs->
                                 super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 6));
  }
  p_Var1 = (input->named_parameters->_M_h)._M_before_begin._M_nxt;
  while( true ) {
    if (p_Var1 == (_Hash_node_base *)0x0) {
      *local_40._M_head_impl = (FunctionData)local_88._M_head_impl;
      return ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             local_40._M_head_impl).
             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>;
    }
    iVar4 = ::std::__cxx11::string::compare((char *)(p_Var1 + 1));
    if (iVar4 != 0) break;
    bVar3 = BooleanValue::Get((Value *)(p_Var1 + 5));
    pTVar5 = unique_ptr<duckdb::TestVectorBindData,_std::default_delete<duckdb::TestVectorBindData>,_true>
             ::operator->((unique_ptr<duckdb::TestVectorBindData,_std::default_delete<duckdb::TestVectorBindData>,_true>
                           *)&local_88);
    pTVar5->all_flat = bVar3;
    p_Var1 = p_Var1->_M_nxt;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Unrecognized named parameter for test_vector_types","");
  InternalException::InternalException(this_00,&local_60);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> TestVectorTypesBind(ClientContext &context, TableFunctionBindInput &input,
                                                    vector<LogicalType> &return_types, vector<string> &names) {
	auto result = make_uniq<TestVectorBindData>();
	for (idx_t i = 0; i < input.inputs.size(); i++) {
		string name = "test_vector";
		if (i > 0) {
			name += to_string(i + 1);
		}
		auto &input_val = input.inputs[i];
		names.emplace_back(name);
		return_types.push_back(input_val.type());
		result->types.push_back(input_val.type());
	}
	for (auto &entry : input.named_parameters) {
		if (entry.first == "all_flat") {
			result->all_flat = BooleanValue::Get(entry.second);
		} else {
			throw InternalException("Unrecognized named parameter for test_vector_types");
		}
	}
	return std::move(result);
}